

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QHash<int,_QVariant>_>::reallocateAndGrow
          (QArrayDataPointer<QHash<int,_QVariant>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QHash<int,_QVariant>_> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  QHash<int,_QVariant> *pQVar4;
  QHash<int,_QVariant> *pQVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QArrayDataPointer<QHash<int,_QVariant>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QHash<int,_QVariant>_> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar8 = QArrayData::reallocateUnaligned
                       (pQVar1,this->ptr,8,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3),
                        Grow);
    this->d = (Data *)auVar8._0_8_;
    this->ptr = (QHash<int,_QVariant> *)auVar8._8_8_;
  }
  else {
    local_38.size = -0x5555555555555556;
    local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_38.ptr = (QHash<int,_QVariant> *)0xaaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    lVar6 = this->size;
    if (lVar6 == 0) {
      lVar6 = 0;
    }
    else {
      lVar7 = (n >> 0x3f & n) + lVar6;
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QHash<int,_QVariant>_> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if ((lVar7 != 0) && (0 < lVar7)) {
          pQVar5 = this->ptr;
          pQVar4 = pQVar5 + lVar7;
          do {
            pDVar2 = pQVar5->d;
            local_38.ptr[local_38.size].d = pDVar2;
            if ((pDVar2 != (Data *)0x0) &&
               ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
              LOCK();
              (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
                   (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pQVar5 = pQVar5 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar5 < pQVar4);
          lVar6 = this->size;
        }
      }
      else if ((lVar7 != 0) && (0 < lVar7)) {
        pQVar5 = this->ptr;
        pQVar4 = pQVar5 + lVar7;
        do {
          pDVar2 = pQVar5->d;
          pQVar5->d = (Data *)0x0;
          local_38.ptr[local_38.size].d = pDVar2;
          pQVar5 = pQVar5 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar5 < pQVar4);
      }
    }
    pDVar3 = this->d;
    pQVar4 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    this->size = local_38.size;
    local_38.d = pDVar3;
    local_38.ptr = pQVar4;
    local_38.size = lVar6;
    if (old != (QArrayDataPointer<QHash<int,_QVariant>_> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = pQVar4;
      local_38.size = old->size;
      old->size = lVar6;
    }
    ~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }